

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SRUP_Observation_Req.cpp
# Opt level: O1

bool __thiscall SRUP_MSG_OBSERVE_REQ::Serialize(SRUP_MSG_OBSERVE_REQ *this,bool preSign)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  uint8_t uVar4;
  bool bVar5;
  uint16_t uVar6;
  int iVar7;
  uint8_t *puVar8;
  uint8_t *puVar9;
  uint8_t *puVar10;
  char *__src;
  int iVar11;
  char *__salt;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  
  if ((this->super_SRUP_MSG_OBS_BASE).super_SRUP_MSG.m_token == (uint8_t *)0x0) {
    return false;
  }
  if (((this->super_SRUP_MSG_OBS_BASE).super_SRUP_MSG.m_sequence_ID == (uint64_t *)0x0) ||
     ((this->super_SRUP_MSG_OBS_BASE).super_SRUP_MSG.m_sender_ID == (uint64_t *)0x0)) {
LAB_00192c7f:
    bVar5 = false;
  }
  else {
    puVar8 = (uint8_t *)operator_new__(1);
    puVar9 = (uint8_t *)operator_new__(1);
    if (preSign) {
      uVar1 = (this->super_SRUP_MSG_OBS_BASE).super_SRUP_MSG.m_token_len;
      uVar6 = SRUP_Crypto::cryptLen((this->super_SRUP_MSG_OBS_BASE).m_crypto);
      iVar7 = (uint)uVar6 + (uint)uVar1;
      iVar11 = 4;
    }
    else {
      uVar1 = (this->super_SRUP_MSG_OBS_BASE).super_SRUP_MSG.m_sig_len;
      uVar2 = (this->super_SRUP_MSG_OBS_BASE).super_SRUP_MSG.m_token_len;
      uVar6 = SRUP_Crypto::cryptLen((this->super_SRUP_MSG_OBS_BASE).m_crypto);
      iVar7 = (uint)uVar6 + (uint)uVar2 + (uint)uVar1;
      iVar11 = 6;
    }
    (this->super_SRUP_MSG_OBS_BASE).super_SRUP_MSG.m_serial_length = iVar7 + iVar11 + 0x1a;
    puVar10 = (this->super_SRUP_MSG_OBS_BASE).super_SRUP_MSG.m_serialized;
    if (puVar10 != (uint8_t *)0x0) {
      operator_delete__(puVar10);
    }
    uVar12 = (ulong)(this->super_SRUP_MSG_OBS_BASE).super_SRUP_MSG.m_serial_length;
    puVar10 = (uint8_t *)operator_new__(uVar12);
    (this->super_SRUP_MSG_OBS_BASE).super_SRUP_MSG.m_serialized = puVar10;
    lVar13 = 0;
    memset(puVar10,0,uVar12);
    *puVar10 = *(this->super_SRUP_MSG_OBS_BASE).super_SRUP_MSG.m_version;
    puVar10[1] = *(this->super_SRUP_MSG_OBS_BASE).super_SRUP_MSG.m_msgtype;
    do {
      uVar4 = SRUP_MSG::getByteVal
                        (*(this->super_SRUP_MSG_OBS_BASE).super_SRUP_MSG.m_sequence_ID,
                         (uint8_t)lVar13);
      (this->super_SRUP_MSG_OBS_BASE).super_SRUP_MSG.m_serialized[lVar13 + 2] = uVar4;
      lVar13 = lVar13 + 1;
    } while ((int)lVar13 != 8);
    lVar13 = 0;
    do {
      uVar4 = SRUP_MSG::getByteVal
                        (*(this->super_SRUP_MSG_OBS_BASE).super_SRUP_MSG.m_sender_ID,(uint8_t)lVar13
                        );
      (this->super_SRUP_MSG_OBS_BASE).super_SRUP_MSG.m_serialized[lVar13 + 10] = uVar4;
      lVar13 = lVar13 + 1;
    } while ((int)lVar13 != 8);
    SRUP_MSG::encodeLength(puVar9,puVar8,(this->super_SRUP_MSG_OBS_BASE).super_SRUP_MSG.m_token_len)
    ;
    (this->super_SRUP_MSG_OBS_BASE).super_SRUP_MSG.m_serialized[0x12] = *puVar8;
    (this->super_SRUP_MSG_OBS_BASE).super_SRUP_MSG.m_serialized[0x13] = *puVar9;
    memcpy((this->super_SRUP_MSG_OBS_BASE).super_SRUP_MSG.m_serialized + 0x14,
           (this->super_SRUP_MSG_OBS_BASE).super_SRUP_MSG.m_token,
           (ulong)(this->super_SRUP_MSG_OBS_BASE).super_SRUP_MSG.m_token_len);
    uVar14 = (ulong)(this->super_SRUP_MSG_OBS_BASE).super_SRUP_MSG.m_token_len;
    uVar12 = uVar14 + 0x14;
    if (!preSign) {
      if (((this->super_SRUP_MSG_OBS_BASE).super_SRUP_MSG.m_signature == (uint8_t *)0x0) ||
         (uVar6 = (this->super_SRUP_MSG_OBS_BASE).super_SRUP_MSG.m_sig_len, uVar6 == 0)) {
        operator_delete__(puVar8);
        operator_delete__(puVar9);
        goto LAB_00192c7f;
      }
      SRUP_MSG::encodeLength(puVar9,puVar8,uVar6);
      (this->super_SRUP_MSG_OBS_BASE).super_SRUP_MSG.m_serialized[uVar12] = *puVar8;
      (this->super_SRUP_MSG_OBS_BASE).super_SRUP_MSG.m_serialized[uVar14 + 0x15] = *puVar9;
      memcpy((this->super_SRUP_MSG_OBS_BASE).super_SRUP_MSG.m_serialized + uVar14 + 0x16,
             (this->super_SRUP_MSG_OBS_BASE).super_SRUP_MSG.m_signature,
             (ulong)(this->super_SRUP_MSG_OBS_BASE).super_SRUP_MSG.m_sig_len);
      uVar12 = (ulong)((uint)(this->super_SRUP_MSG_OBS_BASE).super_SRUP_MSG.m_sig_len +
                      (int)(uVar14 + 0x16));
    }
    iVar7 = 0;
    do {
      uVar14 = uVar12;
      uVar4 = SRUP_MSG::getByteVal(*this->m_joining_device_id,(uint8_t)iVar7);
      (this->super_SRUP_MSG_OBS_BASE).super_SRUP_MSG.m_serialized[uVar14] = uVar4;
      iVar7 = iVar7 + 1;
      uVar12 = uVar14 + 1;
    } while (iVar7 != 8);
    uVar6 = SRUP_Crypto::cryptLen((this->super_SRUP_MSG_OBS_BASE).m_crypto);
    puVar10 = puVar8;
    SRUP_MSG::encodeLength(puVar9,puVar8,uVar6);
    (this->super_SRUP_MSG_OBS_BASE).super_SRUP_MSG.m_serialized[uVar14 + 1] = *puVar8;
    (this->super_SRUP_MSG_OBS_BASE).super_SRUP_MSG.m_serialized[uVar14 + 2] = *puVar9;
    __src = SRUP_Crypto::crypt((this->super_SRUP_MSG_OBS_BASE).m_crypto,(char *)puVar10,__salt);
    memcpy((this->super_SRUP_MSG_OBS_BASE).super_SRUP_MSG.m_serialized + uVar14 + 3,__src,
           (ulong)uVar6);
    operator_delete__(puVar8);
    operator_delete__(puVar9);
    if (preSign) {
      puVar8 = (this->super_SRUP_MSG_OBS_BASE).super_SRUP_MSG.m_unsigned_message;
      if (puVar8 != (uint8_t *)0x0) {
        operator_delete__(puVar8);
      }
      uVar3 = (this->super_SRUP_MSG_OBS_BASE).super_SRUP_MSG.m_serial_length;
      puVar9 = (uint8_t *)operator_new__((ulong)uVar3);
      (this->super_SRUP_MSG_OBS_BASE).super_SRUP_MSG.m_unsigned_message = puVar9;
      puVar8 = (this->super_SRUP_MSG_OBS_BASE).super_SRUP_MSG.m_serialized;
      memcpy(puVar9,puVar8,(ulong)uVar3);
      (this->super_SRUP_MSG_OBS_BASE).super_SRUP_MSG.m_unsigned_length = uVar3;
      (this->super_SRUP_MSG_OBS_BASE).super_SRUP_MSG.m_serial_length = 0;
      if (puVar8 != (uint8_t *)0x0) {
        operator_delete__(puVar8);
      }
      (this->super_SRUP_MSG_OBS_BASE).super_SRUP_MSG.m_serialized = (uint8_t *)0x0;
    }
    (this->super_SRUP_MSG_OBS_BASE).super_SRUP_MSG.m_is_serialized = true;
    bVar5 = true;
  }
  return bVar5;
}

Assistant:

bool SRUP_MSG_OBSERVE_REQ::Serialize(bool preSign)
{
    // As we're using dynamic memory - and only storing / sending the length of the data we have
    // we need to know how long all of the fields are so that we can unmarshall the data at
    // the other end...

    const uint16_t header_size = 18; // Two-bytes for the main header - plus 8 for the sequence ID + 8 for the sender ID
    const uint8_t field_length_size = 2;

    // We need the number of variable length fields - including the m_sig_len...
    // ... this can't be const as we need to change it depending on whether or not we're in pre-sign.
    // (If we are we need to reduce it by one for the unused m_sig_len)
    // Here it will be 3 - signature, token, and encrypted_data...
    uint8_t var_length_field_count = 3;

    // And we need one more – for the joining device ID = 8 bytes
    const uint8_t dev_id_length = 8;

    uint32_t serial_len;
    uint32_t p=0;

    uint8_t * msb;
    uint8_t * lsb;

    if (m_token == nullptr)
        return false;

    // Now check that we have a sequence ID...
    if (m_sequence_ID == nullptr)
        return false;

    // ...and check that we have a sender ID ...
    if (m_sender_ID == nullptr)
        return false;

    msb=new uint8_t[1];
    lsb=new uint8_t[1];

    // If we're calling this as a prelude to signing / verifying then we need to exclude the signature data from the
    // serial data we generate...

    if (preSign)
    {
        serial_len = m_token_len + m_crypto->cryptLen();
        var_length_field_count--;
    }
    else
        serial_len = m_sig_len + m_token_len + m_crypto->cryptLen();

    m_serial_length = serial_len + header_size + (field_length_size * var_length_field_count) + dev_id_length;

    delete[] m_serialized;

    m_serialized = new uint8_t[m_serial_length];
    std::memset(m_serialized, 0, m_serial_length);

    // The first two fields are fixed length (1 byte each).
    std::memcpy(m_serialized, m_version, 1);
    p+=1;
    std::memcpy(m_serialized + p, m_msgtype, 1);
    p+=1;

    // Now we need to add the Sequence ID (uint64_t)
    // See SRUP_Init.cpp for details...
    for (int x=0;x<8;x++)
    {
        uint8_t byte;
        byte = getByteVal(*m_sequence_ID, x);
        std::memcpy(m_serialized + p, &byte, 1);
        p+=1;
    }

    // And we need to do the same thing for the Sender ID (uint64_t)
    for (int x=0;x<8;x++)
    {
        uint8_t byte;
        byte = getByteVal(*m_sender_ID, x);
        std::memcpy(m_serialized + p, &byte, 1);
        p+=1;
    }

    // For the other fields need their length to be specified...

    // The token...
    encodeLength(lsb, msb, m_token_len);
    std::memcpy(m_serialized + p, msb, 1);
    p+=1;
    std::memcpy(m_serialized + p, lsb, 1);
    p+=1;
    std::memcpy(m_serialized + p, m_token, m_token_len);
    p+=m_token_len;

    // If we're executing Serialize as a part of generating the signature - we can't marshall the signature
    // as we haven't calculated it yet. So only do the signature if we're not in preSign

    if (!preSign)
    {
        if (m_signature == nullptr)
        {
            delete[] msb;
            delete[] lsb;
            return false;
        }
        else
        {
            if (m_sig_len == 0)
            {
                delete[] msb;
                delete[] lsb;
                return false;
            }
            else
            {
                encodeLength(lsb, msb, m_sig_len);
                std::memcpy(m_serialized + p, msb, 1);
                p += 1;
                std::memcpy(m_serialized + p, lsb, 1);
                p += 1;
                std::memcpy(m_serialized + p, m_signature, m_sig_len);
                p += m_sig_len;
            }
        }
    }

    // Now we do the joining device ID (fixed size)
    for (int x=0;x<8;x++)
    {
        uint8_t byte;
        byte = getByteVal(*m_joining_device_id, x);
        std::memcpy(m_serialized + p, &byte, 1);
        p+=1;
    }


    // Lastly we need to add the encrypted data...
    int crypt_len = m_crypto->cryptLen();
    encodeLength(lsb, msb, crypt_len);
    std::memcpy(m_serialized + p, msb, 1);
    p+=1;
    std::memcpy(m_serialized + p, lsb, 1);
    p+=1;

    uint8_t* encrypted_data=m_crypto->crypt();
    std::memcpy(m_serialized + p, encrypted_data, crypt_len);
    // p+=crypt_len; - Not used as this is the last operation.

    delete[] msb;
    delete[] lsb;

    // If we're in preSign we don't have a real value for m_serialized - so copy the data to m_unsigned_message
    // and discard (and reset) m_serialized & m_serial_length...
    if (preSign)
    {
        delete[] m_unsigned_message;
        m_unsigned_message = new unsigned char[m_serial_length];

        std::memcpy(m_unsigned_message, m_serialized, m_serial_length);
        m_unsigned_length = m_serial_length;

        m_serial_length = 0;
        delete[] m_serialized;
        m_serialized= nullptr;
    }

    m_is_serialized = true;
    return true;
}